

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<int> *this;
  pointer piVar1;
  int iVar2;
  value_type vVar3;
  uint32_t uVar4;
  pci_device *ppVar5;
  size_type sVar6;
  pointer piVar7;
  reference pvVar8;
  duration dVar9;
  reference pvVar10;
  rep rVar11;
  iterator __first;
  iterator __last;
  ostream *this_00;
  ulong local_d0;
  size_t i_3;
  duration<long,_std::ratio<1L,_1000000000L>_> local_b0;
  duration<long,_std::ratio<1L,_1000000L>_> local_a8;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> elapsed;
  time_point currentTime;
  size_t i_2;
  int i_1;
  int interval;
  time_point startTime;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> counts;
  size_t i;
  allocator<int> local_41;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> counterIndices;
  void *mmioAddress;
  int sampleCount;
  pci_device *dev;
  
  ppVar5 = anon_unknown.dwarf_4039::getPCIDevice();
  iVar2 = pci_device_map_range
                    (ppVar5,ppVar5->regions[5].base_addr,0x40000,0,
                     &counterIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (iVar2 == 0) {
    sVar6 = std::
            vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
            ::size((vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                    *)(anonymous_namespace)::counters);
    std::allocator<int>::allocator(&local_41);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_40,sVar6,&local_41);
    std::allocator<int>::~allocator(&local_41);
    for (counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage = (pointer)0x0;
        piVar1 = counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
        piVar7 = (pointer)std::vector<int,_std::allocator<int>_>::size
                                    ((vector<int,_std::allocator<int>_> *)local_40), piVar1 < piVar7
        ; counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               (pointer)((long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 1)) {
      vVar3 = (value_type)
              counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_40,
                          (size_type)
                          counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      *pvVar8 = vVar3;
    }
    do {
      sVar6 = std::
              vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
              ::size((vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                      *)(anonymous_namespace)::counters);
      this = (allocator<int> *)((long)&startTime.__d.__r + 7);
      std::allocator<int>::allocator(this);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_78,sVar6,this);
      std::allocator<int>::~allocator((allocator<int> *)((long)&startTime.__d.__r + 7));
      _i_1 = (duration)std::chrono::_V2::steady_clock::now();
      for (i_2._0_4_ = 0; (int)i_2 < 100; i_2._0_4_ = (int)i_2 + 1) {
        for (currentTime.__d.__r = (duration)0;
            dVar9.__r = std::vector<int,_std::allocator<int>_>::size
                                  ((vector<int,_std::allocator<int>_> *)local_78),
            (ulong)currentTime.__d.__r < (ulong)dVar9.__r;
            currentTime.__d.__r = (duration)((long)currentTime.__d.__r + 1)) {
          pvVar10 = std::
                    vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                    ::operator[]((vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                                  *)(anonymous_namespace)::counters,(size_type)currentTime.__d.__r);
          piVar1 = counterIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          if ((pvVar10->isIdle & 1U) == 0) {
            pvVar10 = std::
                      vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                      ::operator[]((vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                                    *)(anonymous_namespace)::counters,(size_type)currentTime.__d.__r
                                  );
            uVar4 = anon_unknown.dwarf_4039::readReg(piVar1,pvVar10->index);
            pvVar10 = std::
                      vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                      ::operator[]((vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                                    *)(anonymous_namespace)::counters,(size_type)currentTime.__d.__r
                                  );
            if ((uVar4 & pvVar10->mask) != 0) {
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_78,
                                  (size_type)currentTime.__d.__r);
              *pvVar8 = *pvVar8 + 1;
            }
          }
          else {
            pvVar10 = std::
                      vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                      ::operator[]((vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                                    *)(anonymous_namespace)::counters,(size_type)currentTime.__d.__r
                                  );
            uVar4 = anon_unknown.dwarf_4039::readReg(piVar1,pvVar10->index);
            pvVar10 = std::
                      vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                      ::operator[]((vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                                    *)(anonymous_namespace)::counters,(size_type)currentTime.__d.__r
                                  );
            if ((uVar4 & pvVar10->mask) == 0) {
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_78,
                                  (size_type)currentTime.__d.__r);
              *pvVar8 = *pvVar8 + 1;
            }
          }
        }
        elapsed.__r = std::chrono::_V2::steady_clock::now();
        local_b0.__r = (rep)std::chrono::operator-
                                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)&elapsed,
                                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)&i_1);
        local_a8.__r = (rep)std::chrono::
                            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                      (&local_b0);
        rVar11 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_a8);
        usleep(((int)i_2 + 1) * 10000 - (int)rVar11);
      }
      __first = std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_40);
      __last = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_40);
      std::
      stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,main::__0>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 __first._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 __last._M_current,(vector<int,_std::allocator<int>_> *)local_78);
      this_00 = std::operator<<((ostream *)&std::cout,"\x1b[2J\x1b[1;1H");
      std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
      for (local_d0 = 0;
          sVar6 = std::
                  vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                  ::size((vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                          *)(anonymous_namespace)::counters), local_d0 < sVar6;
          local_d0 = local_d0 + 1) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_40,local_d0);
        pvVar10 = std::
                  vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                  ::operator[]((vector<(anonymous_namespace)::Counter,_std::allocator<(anonymous_namespace)::Counter>_>
                                *)(anonymous_namespace)::counters,(long)*pvVar8);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_40,local_d0);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_78,(long)*pvVar8);
        anon_unknown.dwarf_4039::printCounter
                  ((ostream *)&std::cout,&pvVar10->name,(*pvVar8 * 100) / 100);
        std::operator<<((ostream *)&std::cout,"\n");
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78)
      ;
    } while( true );
  }
  std::operator<<((ostream *)&std::cerr,"mmio mem map failed (try to run as root)\n");
  exit(1);
}

Assistant:

int main()
{
    auto dev = getPCIDevice(); // yes, we leak this
    int sampleCount = 100;

    void* mmioAddress;

    // TODO: better selection of region & size
    if(pci_device_map_range(dev, dev->regions[5].base_addr, 0x40000, 0, &mmioAddress)) {
        std::cerr << "mmio mem map failed (try to run as root)\n";
        std::exit(1);
    }

    std::vector<int> counterIndices(counters.size());
    for(std::size_t i = 0; i < counterIndices.size(); ++i)
        counterIndices[i] = i;

    for(;;) {

        std::vector<int> counts(counters.size());

        auto startTime = std::chrono::steady_clock::now();
        auto interval = 1000000 / sampleCount;

        for(int i = 0; i < sampleCount; ++i) {
            for(std::size_t i = 0; i < counts.size(); ++i) {
                if(counters[i].isIdle) {
                    if(!(readReg(mmioAddress, counters[i].index) & counters[i].mask))
                        ++counts[i];
                } else {
                    if(readReg(mmioAddress, counters[i].index) & counters[i].mask)
                        ++counts[i];
                }
            }

            auto currentTime = std::chrono::steady_clock::now();
            auto elapsed = std::chrono::duration_cast<std::chrono::microseconds>(currentTime - startTime);
            usleep((i + 1) * interval - elapsed.count());
        }

        std::stable_sort(
            counterIndices.begin(), counterIndices.end(), [&counts](int a, int b) { return counts[a] > counts[b]; });

        std::cout << "\033[2J\033[1;1H" << std::flush; // clears screen

        for(std::size_t i = 0; i < counters.size(); ++i) {
            printCounter(std::cout, counters[counterIndices[i]].name, counts[counterIndices[i]] * 100 / sampleCount);
            std::cout << "\n";
        }
    }
}